

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O0

int HRSS_encap(uint8_t *out_ciphertext,uint8_t *out_shared_key,HRSS_public_key *in_pub,uint8_t *in)

{
  POLY_MUL_SCRATCH *scratch;
  uint local_4c;
  uint i;
  vars *vars;
  void *malloc_ptr;
  public_key *pub;
  uint8_t *in_local;
  HRSS_public_key *in_pub_local;
  uint8_t *out_shared_key_local;
  uint8_t *out_ciphertext_local;
  
  pub = (public_key *)in;
  in_local = in_pub->opaque;
  in_pub_local = (HRSS_public_key *)out_shared_key;
  out_shared_key_local = out_ciphertext;
  malloc_ptr = public_key_from_external(in_pub);
  scratch = (POLY_MUL_SCRATCH *)malloc_align32(&vars,0x9e70);
  if (scratch == (POLY_MUL_SCRATCH *)0x0) {
    memset(out_shared_key_local,0,0x472);
    RAND_bytes(in_pub_local->opaque,0x20);
    out_ciphertext_local._4_4_ = 0;
  }
  else {
    OPENSSL_memset(scratch,0xff,0x9e70);
    poly_short_sample((poly *)(scratch + 1),(uint8_t *)pub);
    poly_short_sample((poly *)((long)&scratch[1].u + 0x580),(uint8_t *)((pub->ph).field_0.v + 0x15e)
                     );
    poly_lift((poly *)((long)&scratch[1].u + 0xb00),(poly *)(scratch + 1));
    poly_mul(scratch,(poly *)((long)&scratch[1].u + 0x1080),(poly *)((long)&scratch[1].u + 0x580),
             (poly *)malloc_ptr);
    for (local_4c = 0; local_4c < 0x2bd; local_4c = local_4c + 1) {
      *(short *)((long)&scratch[1].u + (ulong)local_4c * 2 + 0x1080) =
           *(short *)((long)&scratch[1].u + (ulong)local_4c * 2 + 0x1080) +
           *(short *)((long)&scratch[1].u + (ulong)local_4c * 2 + 0xb00);
    }
    poly_marshal(out_shared_key_local,(poly *)((long)&scratch[1].u + 0x1080));
    poly_marshal_mod3(scratch[1].u.rq + 0x1670,(poly *)(scratch + 1));
    poly_marshal_mod3(scratch[1].u.rq + 0x16fc,(poly *)((long)&scratch[1].u + 0x580));
    SHA256_Init((SHA256_CTX *)((long)&scratch[1].u + 0x1600));
    SHA256_Update((SHA256_CTX *)((long)&scratch[1].u + 0x1600),"shared key",0xb);
    SHA256_Update((SHA256_CTX *)((long)&scratch[1].u + 0x1600),
                  (void *)((long)&scratch[1].u + 0x1670),0x8c);
    SHA256_Update((SHA256_CTX *)((long)&scratch[1].u + 0x1600),
                  (void *)((long)&scratch[1].u + 0x16fc),0x8c);
    SHA256_Update((SHA256_CTX *)((long)&scratch[1].u + 0x1600),out_shared_key_local,0x472);
    SHA256_Final(in_pub_local->opaque,(SHA256_CTX *)((long)&scratch[1].u + 0x1600));
    OPENSSL_free(vars);
    out_ciphertext_local._4_4_ = 1;
  }
  return out_ciphertext_local._4_4_;
}

Assistant:

int HRSS_encap(uint8_t out_ciphertext[POLY_BYTES], uint8_t out_shared_key[32],
               const struct HRSS_public_key *in_pub,
               const uint8_t in[HRSS_SAMPLE_BYTES + HRSS_SAMPLE_BYTES]) {
  const struct public_key *pub =
      public_key_from_external((struct HRSS_public_key *)in_pub);

  struct vars {
    struct POLY_MUL_SCRATCH scratch;
    struct poly m, r, m_lifted;
    struct poly prh_plus_m;
    SHA256_CTX hash_ctx;
    uint8_t m_bytes[HRSS_POLY3_BYTES];
    uint8_t r_bytes[HRSS_POLY3_BYTES];
  };

  void *malloc_ptr;
  struct vars *const vars = reinterpret_cast<struct vars *>(
      malloc_align32(&malloc_ptr, sizeof(struct vars)));
  if (!vars) {
    // If the caller ignores the return value the output will still be safe.
    // The private key output is randomised in case it's used to encrypt and
    // transmit something.
    memset(out_ciphertext, 0, POLY_BYTES);
    RAND_bytes(out_shared_key, 32);
    return 0;
  }

#if !defined(NDEBUG)
  OPENSSL_memset(vars, 0xff, sizeof(struct vars));
#endif

  poly_short_sample(&vars->m, in);
  poly_short_sample(&vars->r, in + HRSS_SAMPLE_BYTES);
  poly_lift(&vars->m_lifted, &vars->m);

  poly_mul(&vars->scratch, &vars->prh_plus_m, &vars->r, &pub->ph);
  for (unsigned i = 0; i < N; i++) {
    vars->prh_plus_m.v[i] += vars->m_lifted.v[i];
  }

  poly_marshal(out_ciphertext, &vars->prh_plus_m);

  poly_marshal_mod3(vars->m_bytes, &vars->m);
  poly_marshal_mod3(vars->r_bytes, &vars->r);

  SHA256_Init(&vars->hash_ctx);
  SHA256_Update(&vars->hash_ctx, kSharedKey, sizeof(kSharedKey));
  SHA256_Update(&vars->hash_ctx, vars->m_bytes, sizeof(vars->m_bytes));
  SHA256_Update(&vars->hash_ctx, vars->r_bytes, sizeof(vars->r_bytes));
  SHA256_Update(&vars->hash_ctx, out_ciphertext, POLY_BYTES);
  SHA256_Final(out_shared_key, &vars->hash_ctx);

  OPENSSL_free(malloc_ptr);
  return 1;
}